

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MemPool.cpp
# Opt level: O1

void amrex_mempool_get_stats(int *mp_min,int *mp_max,int *mp_tot)

{
  undefined8 *puVar1;
  size_t sVar2;
  unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_> *mp;
  undefined8 *puVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  
  puVar1 = DAT_00843500;
  if ((anonymous_namespace)::the_memory_pool == DAT_00843500) {
    iVar6 = -1;
    iVar4 = 0;
    iVar8 = 0;
  }
  else {
    uVar7 = 0xffffffffffffffff;
    uVar9 = 0;
    uVar5 = 0;
    puVar3 = (anonymous_namespace)::the_memory_pool;
    do {
      sVar2 = amrex::CArena::heap_space_used((CArena *)*puVar3);
      if (sVar2 <= uVar7) {
        uVar7 = sVar2;
      }
      if (uVar5 < sVar2) {
        uVar5 = sVar2;
      }
      uVar9 = uVar9 + sVar2;
      puVar3 = puVar3 + 1;
    } while (puVar3 != puVar1);
    iVar6 = (int)(uVar7 >> 0x14);
    iVar4 = (int)(uVar5 >> 0x14);
    iVar8 = (int)(uVar9 >> 0x14);
  }
  *mp_min = iVar6;
  *mp_max = iVar4;
  *mp_tot = iVar8;
  return;
}

Assistant:

void amrex_mempool_get_stats (int& mp_min, int& mp_max, int& mp_tot) // min, max & tot in MB
{
  size_t hsu_min=std::numeric_limits<size_t>::max();
  size_t hsu_max=0;
  size_t hsu_tot=0;
  for (const auto& mp : the_memory_pool) {
    size_t hsu = mp->heap_space_used();
    hsu_min = std::min(hsu, hsu_min);
    hsu_max = std::max(hsu, hsu_max);
    hsu_tot += hsu;
  }
  mp_min = hsu_min/(1024*1024);
  mp_max = hsu_max/(1024*1024);
  mp_tot = hsu_tot/(1024*1024);
}